

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat.c
# Opt level: O0

char * strcat(char *__dest,char *__src)

{
  char cVar1;
  char *rc;
  char *s2_local;
  char *s1_local;
  
  cVar1 = *__dest;
  s2_local = __dest;
  while (rc = __src, cVar1 != '\0') {
    cVar1 = s2_local[1];
    s2_local = s2_local + 1;
  }
  do {
    cVar1 = *rc;
    *s2_local = cVar1;
    rc = rc + 1;
    s2_local = s2_local + 1;
  } while (cVar1 != '\0');
  return __dest;
}

Assistant:

char * strcat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2 )
{
    char * rc = s1;

    if ( *s1 )
    {
        while ( *++s1 )
        {
            /* EMPTY */
        }
    }

    while ( ( *s1++ = *s2++ ) )
    {
        /* EMPTY */
    }

    return rc;
}